

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O1

float ggml_get_f32_1d(ggml_tensor *tensor,int i)

{
  int iVar1;
  
  switch(tensor->type) {
  case GGML_TYPE_Q4_0:
    goto switchD_00124731_caseD_0;
  case GGML_TYPE_Q4_1:
switchD_00124731_caseD_1:
    ggml_get_f32_1d_cold_7();
    goto switchD_00124731_caseD_7;
  case GGML_TYPE_I8:
    if (tensor->nb[0] == 1) {
      iVar1 = (int)*(char *)((long)tensor->data + (long)i);
LAB_00124763:
      return (float)iVar1;
    }
    break;
  case GGML_TYPE_I16:
    if (tensor->nb[0] == 2) {
      iVar1 = (int)*(short *)((long)tensor->data + (long)i * 2);
      goto LAB_00124763;
    }
    ggml_get_f32_1d_cold_5();
    break;
  case GGML_TYPE_I32:
    if (tensor->nb[0] == 4) {
      return (float)*(int *)((long)tensor->data + (long)i * 4);
    }
    goto LAB_001247d1;
  case GGML_TYPE_F16:
    if (tensor->nb[0] == 2) {
      return table_f32_f16[*(ushort *)((long)tensor->data + (long)i * 2)];
    }
    goto LAB_001247d6;
  case GGML_TYPE_F32:
    if (tensor->nb[0] == 4) {
      return *(float *)((long)tensor->data + (long)i * 4);
    }
    goto LAB_001247cc;
  case GGML_TYPE_COUNT:
    goto switchD_00124731_caseD_7;
  default:
    return 0.0;
  }
  ggml_get_f32_1d_cold_6();
LAB_001247cc:
  ggml_get_f32_1d_cold_2();
LAB_001247d1:
  ggml_get_f32_1d_cold_4();
LAB_001247d6:
  ggml_get_f32_1d_cold_3();
switchD_00124731_caseD_0:
  ggml_get_f32_1d_cold_8();
  goto switchD_00124731_caseD_1;
switchD_00124731_caseD_7:
  ggml_get_f32_1d_cold_1();
}

Assistant:

float ggml_get_f32_1d(const struct ggml_tensor * tensor, int i) {
    switch (tensor->type) {
        case GGML_TYPE_Q4_0:
            {
                GGML_ASSERT(false);
            } break;
        case GGML_TYPE_Q4_1:
            {
                GGML_ASSERT(false);
            } break;
        case GGML_TYPE_I8:
            {
                GGML_ASSERT(tensor->nb[0] == sizeof(int8_t));
                return ((int8_t *)(tensor->data))[i];
            } break;
        case GGML_TYPE_I16:
            {
                GGML_ASSERT(tensor->nb[0] == sizeof(int16_t));
                return ((int16_t *)(tensor->data))[i];
            } break;
        case GGML_TYPE_I32:
            {
                GGML_ASSERT(tensor->nb[0] == sizeof(int32_t));
                return ((int32_t *)(tensor->data))[i];
            } break;
        case GGML_TYPE_F16:
            {
                GGML_ASSERT(tensor->nb[0] == sizeof(ggml_fp16_t));
                return GGML_FP16_TO_FP32(((ggml_fp16_t *)(tensor->data))[i]);
            } break;
        case GGML_TYPE_F32:
            {
                GGML_ASSERT(tensor->nb[0] == sizeof(float));
                return ((float *)(tensor->data))[i];
            } break;
        case GGML_TYPE_COUNT:
            {
                GGML_ASSERT(false);
            } break;
    }

    return 0.0f;
}